

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindOrCreateWindowSettings(char *name)

{
  ImVec2ih *pIVar1;
  int iVar2;
  ImGuiID IVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiWindowSettings *pIVar5;
  
  IVar3 = ImHashStr(name,0,0);
  pIVar4 = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
  pIVar1 = &pIVar4->Pos;
  if (pIVar4 != (ImGuiWindowSettings *)0x0) {
    pIVar5 = (ImGuiWindowSettings *)pIVar1;
    do {
      pIVar4 = pIVar5;
      if (pIVar4->ID == IVar3) break;
      iVar2._0_1_ = pIVar4[-1].Collapsed;
      iVar2._1_1_ = pIVar4[-1].WantApply;
      iVar2._2_2_ = *(undefined2 *)&pIVar4[-1].field_0xe;
      pIVar5 = (ImGuiWindowSettings *)((long)&pIVar4->ID + (long)iVar2);
      pIVar4 = (ImGuiWindowSettings *)0x0;
    } while (pIVar5 != (ImGuiWindowSettings *)
                       ((long)&pIVar1->x + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  if (pIVar4 != (ImGuiWindowSettings *)0x0) {
    return pIVar4;
  }
  pIVar4 = CreateNewWindowSettings(name);
  return pIVar4;
}

Assistant:

ImGuiWindowSettings* ImGui::FindOrCreateWindowSettings(const char* name)
{
    if (ImGuiWindowSettings* settings = FindWindowSettings(ImHashStr(name)))
        return settings;
    return CreateNewWindowSettings(name);
}